

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void sqlite3IdListDelete(sqlite3 *db,IdList *pList)

{
  void *p;
  int iVar1;
  long lVar2;
  long lVar3;
  
  if (pList != (IdList *)0x0) {
    iVar1 = pList->nId;
    if (0 < iVar1) {
      lVar3 = 0;
      lVar2 = 0;
      do {
        p = *(void **)((long)&pList->a->zName + lVar3);
        if (p != (void *)0x0) {
          sqlite3DbFreeNN(db,p);
          iVar1 = pList->nId;
        }
        lVar2 = lVar2 + 1;
        lVar3 = lVar3 + 0x10;
      } while (lVar2 < iVar1);
    }
    if (pList->a != (IdList_item *)0x0) {
      sqlite3DbFreeNN(db,pList->a);
    }
    sqlite3DbFreeNN(db,pList);
    return;
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3IdListDelete(sqlite3 *db, IdList *pList){
  int i;
  if( pList==0 ) return;
  for(i=0; i<pList->nId; i++){
    sqlite3DbFree(db, pList->a[i].zName);
  }
  sqlite3DbFree(db, pList->a);
  sqlite3DbFreeNN(db, pList);
}